

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_schema_nodeid
              (char *nodeid,lys_node *start_parent,lys_module *cur_module,ly_set **ret,int extended,
              int no_node_error)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  lys_module *plVar7;
  lys_node *last;
  lys_node *last_00;
  lys_node *plVar8;
  ly_set *plVar9;
  char *pcVar10;
  undefined4 extraout_var_00;
  lys_node *parent;
  lys_node *plVar11;
  char *pcVar12;
  lys_node *plVar13;
  ly_ctx *plVar14;
  undefined4 in_register_00000084;
  uint8_t *puVar15;
  undefined8 uVar16;
  int *all_desc_00;
  ulong uVar17;
  lys_node *plVar18;
  lys_node *plVar19;
  char *yang_data_name;
  LY_ECODE ecode;
  char *local_e8;
  int local_e0;
  int local_dc;
  int nam_len_1;
  char *model;
  lys_module *local_c8;
  char *local_c0;
  int local_b4;
  int local_b0;
  int mod_len;
  int has_predicate_1;
  int all_desc;
  char *name;
  lys_node *local_98;
  int local_8c;
  lys_node *plStack_88;
  int has_predicate;
  int local_7c;
  char *local_78;
  char *mod_name;
  lys_module *local_68;
  lys_node *local_60;
  int local_54;
  int iStack_50;
  int nam_len;
  int local_44;
  ly_ctx *plStack_40;
  int is_relative;
  int local_34 [2];
  int mod_name_len;
  
  name = (char *)CONCAT44(in_register_00000084,extended);
  local_34[0] = 0;
  local_44 = -1;
  if (((nodeid == (char *)0x0) ||
      (start_parent == (lys_node *)0x0 && cur_module == (lys_module *)0x0)) ||
     (ret == (ly_set **)0x0)) {
    __assert_fail("nodeid && (start_parent || cur_module) && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x766,
                  "int resolve_schema_nodeid(const char *, const struct lys_node *, const struct lys_module *, struct ly_set **, int, int)"
                 );
  }
  *ret = (ly_set *)0x0;
  local_dc = no_node_error;
  if (cur_module == (lys_module *)0x0) {
    cur_module = lys_node_module(start_parent);
  }
  plVar14 = cur_module->ctx;
  local_68 = cur_module;
  uVar2 = parse_schema_nodeid(nodeid,&local_78,local_34,(char **)&has_predicate_1,&local_54,
                              &local_44,(int *)0x0,(int *)0x0,1);
  if ((int)uVar2 < 1) {
    _has_predicate_1 = nodeid + -uVar2;
    uVar17 = (ulong)(uint)(int)nodeid[-uVar2];
LAB_00112727:
    ly_vlog(plVar14,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar17,_has_predicate_1);
  }
  else {
    mod_name = (char *)ret;
    if (*_has_predicate_1 == '#') {
      if (local_44 != 0) {
        uVar17 = 0x23;
        goto LAB_00112727;
      }
      yang_data_name = _has_predicate_1 + 1;
      _iStack_50 = (lys_node *)CONCAT44(nam_len,local_54 + -1);
      pcVar10 = local_78;
      pcVar12 = nodeid + uVar2;
      iVar5 = local_34[0];
    }
    else {
      local_44 = -1;
      pcVar10 = (char *)0x0;
      yang_data_name = (char *)0x0;
      iVar5 = 0;
      pcVar12 = nodeid;
    }
    all_desc_00 = &mod_len;
    if ((int)name == 0) {
      all_desc_00 = (int *)0x0;
    }
    local_c0 = nodeid;
    plStack_40 = plVar14;
    iVar3 = parse_schema_nodeid(pcVar12,&local_78,local_34,(char **)&has_predicate_1,&local_54,
                                &local_44,&local_8c,all_desc_00,(int)name);
    plVar13 = (lys_node *)CONCAT44(extraout_var,iVar3);
    if (iVar3 < 1) {
      puVar15 = (uint8_t *)(pcVar12 + (uint)-iVar3);
      uVar1 = pcVar12[(uint)-iVar3];
      plVar14 = plStack_40;
LAB_00112e5d:
      ly_vlog(plVar14,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)(char)uVar1,puVar15
             );
    }
    else {
      if (pcVar10 != (char *)0x0) {
        local_78 = pcVar10;
        local_34[0] = iVar5;
      }
      local_60 = plVar13;
      if (local_44 != 0 && start_parent == (lys_node *)0x0) {
        ly_vlog(plStack_40,LYE_SPEC,LY_VLOG_STR,local_c0,
                "Starting node must be provided for relative paths.");
        return -1;
      }
      if (local_44 != 0) {
        local_68 = lys_node_module(start_parent);
        model = (char *)local_68;
        goto LAB_0011280f;
      }
      model = (char *)lyp_get_module(local_68,(char *)0x0,0,local_78,local_34[0],0);
      if ((lys_module *)model == (lys_module *)0x0) {
LAB_00112f1c:
        pcVar10 = strndup(local_78,(long)local_34[0]);
        ecode = LYE_PATH_INMOD;
      }
      else {
        if (yang_data_name == (char *)0x0) {
          start_parent = (lys_node *)0x0;
LAB_0011280f:
          plVar13 = (lys_node *)(pcVar12 + ((ulong)local_60 & 0xffffffff));
          iVar5 = 0;
          plVar7 = (lys_module *)0x0;
          local_98 = start_parent;
LAB_00112827:
          iVar3 = local_34[0];
          pcVar10 = local_78;
          if (local_98 == (lys_node *)0x0) {
            plVar11 = (lys_node *)0x0;
            last = (lys_node *)0x0;
            plVar18 = local_60;
            local_c8 = plVar7;
            goto LAB_001128c9;
          }
          plVar7 = local_68;
          if (local_78 != (char *)0x0) {
            pcVar12 = local_68->name;
            iVar4 = strncmp(local_78,pcVar12,(long)local_34[0]);
            if (((iVar4 != 0) || (sVar6 = strlen(pcVar12), plVar7 = local_68, iVar3 != (int)sVar6))
               && (plVar7 = lyp_get_module(local_68,(char *)0x0,0,pcVar10,iVar3,0),
                  plVar7 == (lys_module *)0x0)) goto LAB_00112f1c;
          }
          last = (lys_node *)0x0;
          plVar18 = local_60;
          plVar11 = local_98;
          local_c8 = plVar7;
          if ((int)name != 0) goto LAB_001128c9;
LAB_00112df2:
          plVar11 = local_98;
          last = (lys_node *)lys_getnext_target_aug((lys_node_augment *)last,local_c8,local_98);
LAB_001128c9:
          parent = last;
          if (last == (lys_node *)0x0) {
            parent = plVar11;
          }
          last_00 = (lys_node *)0x0;
          local_98 = plVar11;
switchD_00112af9_caseD_1:
          local_7c = iVar5;
          plStack_88 = last;
          _iStack_50 = plVar13;
          while( true ) {
            last_00 = lys_getnext(last_00,parent,(lys_module *)model,0x18b);
            iVar5 = local_7c;
            if (last_00 == (lys_node *)0x0) goto LAB_00112d31;
            uVar2 = schema_nodeid_siblingcheck
                              (last_00,local_68,local_78,local_34[0],_has_predicate_1,local_54);
            plVar18 = (lys_node *)(ulong)uVar2;
            if ((((int)name == 0) || (uVar2 != 3 && (uVar2 & 0xfffffffd) != 0)) || (local_8c == 0))
            break;
            plVar13 = _iStack_50;
            if ((last_00->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
LAB_00112979:
              uVar2 = parse_schema_json_predicate
                                ((char *)plVar13,(char **)&nam_len_1,&local_b4,&local_e8,&local_e0,
                                 (char **)0x0,(int *)0x0,&local_b0);
              if ((int)uVar2 < 1) {
                puVar15 = plVar13->padding + (long)(int)uVar2 + -0x1c;
                uVar1 = plVar13->padding[(long)(int)uVar2 + -0x1c];
                plVar14 = local_68->ctx;
                goto LAB_00112e5d;
              }
              if (last_00->nodetype == LYS_LEAFLIST) {
                if (((local_e8 != (char *)0x0 && _nam_len_1 == (char *)0x0) && (*local_e8 == '.'))
                   && (plVar13 = (lys_node *)(plVar13->padding + ((ulong)uVar2 - 0x1c)),
                      local_b0 == 0)) goto LAB_00112cd2;
              }
              else {
                local_60 = (lys_node *)(plVar13->padding + ((ulong)uVar2 - 0x1c));
                for (uVar17 = 0; uVar17 < last_00->padding[2]; uVar17 = uVar17 + 1) {
                  plVar13 = *(lys_node **)(*(long *)&last_00[1].flags + uVar17 * 8);
                  pcVar10 = plVar13->name;
                  sVar6 = (size_t)local_e0;
                  iVar5 = strncmp(pcVar10,local_e8,sVar6);
                  pcVar12 = _nam_len_1;
                  if ((iVar5 == 0) && (pcVar10[sVar6] == '\0')) {
                    plVar7 = lys_node_module(plVar13);
                    if (pcVar12 == (char *)0x0) {
                      if (plVar7 == local_68) break;
                    }
                    else {
                      iVar5 = strncmp(plVar7->name,_nam_len_1,(long)local_b4);
                      if ((iVar5 == 0) &&
                         (plVar7 = lys_node_module(*(lys_node **)
                                                    (*(long *)&last_00[1].flags + uVar17 * 8)),
                         plVar7->name[local_b4] == '\0')) break;
                    }
                  }
                }
                if (last_00->padding[2] != uVar17) goto code_r0x00112a79;
              }
            }
            plVar18 = (lys_node *)0x1;
          }
          iVar5 = local_7c;
          if (*(char *)&_iStack_50->name == '\0') {
            iVar5 = 1;
          }
          last = plStack_88;
          plVar13 = _iStack_50;
          switch(uVar2) {
          case 0:
            goto switchD_00112af9_caseD_0;
          case 1:
            goto switchD_00112af9_caseD_1;
          case 2:
            plVar9 = *(ly_set **)mod_name;
            local_7c = iVar5;
            if (plVar9 == (ly_set *)0x0) {
              plVar9 = ly_set_new();
              *(ly_set **)mod_name = plVar9;
              if (plVar9 == (ly_set *)0x0) goto LAB_00112f58;
            }
            ly_set_add(plVar9,last_00,1);
            last = plStack_88;
            plVar13 = _iStack_50;
            plVar11 = last_00;
            iVar5 = local_7c;
            if (mod_len != 0) {
LAB_00112b42:
              iVar5 = local_7c;
              if (plVar11 != (lys_node *)0x0) {
                if (plVar11 != last_00) {
                  ly_set_add(*(ly_set **)mod_name,plVar11,1);
                  last = plStack_88;
                  plVar13 = _iStack_50;
                }
                plVar19 = plVar11;
                if (((plVar11->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
                   (plVar8 = plVar11->child, plVar8 != (lys_node *)0x0)) goto LAB_00112b95;
                iVar5 = local_7c;
                if (plVar11 == last_00) goto switchD_00112af9_caseD_1;
                do {
                  plVar8 = plVar19->next;
LAB_00112b95:
                  plVar11 = plVar8;
                  if (plVar8 != (lys_node *)0x0) break;
                  plVar19 = plVar19->parent;
                  if (plVar19->nodetype == LYS_AUGMENT) {
                    plVar19 = plVar19->prev;
                  }
                  local_60 = lys_parent(plVar19);
                  plVar8 = lys_parent(last_00);
                  last = plStack_88;
                  plVar13 = _iStack_50;
                } while (local_60 != plVar8);
                goto LAB_00112b42;
              }
            }
            goto switchD_00112af9_caseD_1;
          case 3:
            plVar9 = *(ly_set **)mod_name;
            local_7c = iVar5;
            if (plVar9 == (ly_set *)0x0) {
              plVar9 = ly_set_new();
              *(ly_set **)mod_name = plVar9;
              if (plVar9 == (ly_set *)0x0) goto LAB_00112f58;
              if (local_98 != (lys_node *)0x0) {
                ly_set_add(plVar9,local_98,1);
                plVar9 = *(ly_set **)mod_name;
              }
            }
            ly_set_add(plVar9,last_00,1);
            last = plStack_88;
            plVar13 = _iStack_50;
            plVar11 = last_00;
            iVar5 = local_7c;
            if (mod_len != 0) {
LAB_00112c3b:
              plVar19 = plVar11;
              iVar5 = local_7c;
              if (plVar19 != (lys_node *)0x0) {
                if (plVar19 != last_00) {
                  ly_set_add(*(ly_set **)mod_name,plVar19,1);
                  last = plStack_88;
                  plVar13 = _iStack_50;
                }
                if (((plVar19->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
                   (plVar11 = plVar19->child, plVar11 != (lys_node *)0x0)) goto LAB_00112c8e;
                iVar5 = local_7c;
                if (plVar19 == last_00) goto switchD_00112af9_caseD_1;
                do {
                  plVar11 = plVar19->next;
LAB_00112c8e:
                  if (plVar11 != (lys_node *)0x0) break;
                  plVar19 = plVar19->parent;
                  if (plVar19->nodetype == LYS_AUGMENT) {
                    plVar19 = plVar19->prev;
                  }
                  local_60 = lys_parent(plVar19);
                  plVar8 = lys_parent(last_00);
                  last = plStack_88;
                  plVar13 = _iStack_50;
                } while (local_60 != plVar8);
                goto LAB_00112c3b;
              }
            }
            goto switchD_00112af9_caseD_1;
          default:
            uVar16 = 0x80e;
            goto LAB_00112f10;
          }
        }
        iVar5 = iStack_50;
        start_parent = lyp_get_yang_data_template((lys_module *)model,yang_data_name,iStack_50);
        if (start_parent != (lys_node *)0x0) goto LAB_0011280f;
        pcVar10 = strndup(local_c0,(size_t)(yang_data_name + ((long)iVar5 - (long)local_c0)));
        ecode = LYE_PATH_INNODE;
      }
      ly_vlog(plStack_40,ecode,LY_VLOG_STR,pcVar10);
      free(pcVar10);
    }
  }
  return -1;
code_r0x00112a79:
  plVar13 = local_60;
  if (local_b0 == 0) {
LAB_00112cd2:
    iVar5 = local_7c;
    iVar3 = 1;
    if (*(uint8_t *)&plVar13->name != '\0') goto switchD_00112af9_caseD_0;
    goto LAB_00112ce5;
  }
  goto LAB_00112979;
code_r0x00112d83:
  uVar2 = parse_schema_nodeid((char *)plVar13,&local_78,local_34,(char **)&has_predicate_1,&local_54
                              ,&local_44,&local_8c,all_desc_00,(int)name);
  if ((int)uVar2 < 1) {
    puVar15 = plVar13->padding + ((ulong)-uVar2 - 0x1c);
    uVar1 = plVar13->padding[(ulong)-uVar2 - 0x1c];
    plVar14 = plStack_40;
    goto LAB_00112e5d;
  }
  plVar13 = (lys_node *)(plVar13->padding + ((ulong)uVar2 - 0x1c));
  plVar7 = local_c8;
  local_60 = (lys_node *)CONCAT44(extraout_var_00,uVar2);
  goto LAB_00112827;
switchD_00112af9_caseD_0:
  local_7c = iVar5;
  iVar3 = local_7c;
  if (local_7c == 0) {
    plVar18 = (lys_node *)0x0;
    local_98 = last_00;
    iVar5 = 0;
    if ((last_00->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      return -1;
    }
  }
  else {
LAB_00112ce5:
    plVar9 = ly_set_new();
    *(ly_set **)mod_name = plVar9;
    if (plVar9 == (ly_set *)0x0) {
LAB_00112f58:
      ly_log(plStack_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_schema_nodeid")
      ;
      return -1;
    }
    ly_set_add(plVar9,last_00,1);
    plVar18 = (lys_node *)0x0;
    iVar5 = iVar3;
  }
LAB_00112d31:
  plVar13 = _iStack_50;
  if (((int)name != 0) && (local_8c != 0)) {
    while (*(char *)&plVar13->name == '[') {
      pcVar10 = strchr((char *)plVar13,0x5d);
      plVar13 = (lys_node *)(pcVar10 + 1);
      if (pcVar10 == (char *)0x0) {
        uVar16 = 0x818;
LAB_00112f10:
        ly_log(plStack_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,uVar16);
        return -1;
      }
    }
  }
  if (((iVar5 == 0) || (3 < (uint)plVar18)) || ((uint)plVar18 == 1)) {
    if (last_00 != (lys_node *)0x0) goto code_r0x00112d83;
    last = plStack_88;
    if (plStack_88 != (lys_node *)0x0) goto LAB_00112df2;
    if (local_dc != 0) {
      pcVar10 = strndup(local_c0,(size_t)(_has_predicate_1 + ((long)local_54 - (long)local_c0)));
      ly_vlog(plStack_40,LYE_PATH_INNODE,LY_VLOG_STR,pcVar10);
      free(pcVar10);
      return -1;
    }
    mod_name[0] = '\0';
    mod_name[1] = '\0';
    mod_name[2] = '\0';
    mod_name[3] = '\0';
    mod_name[4] = '\0';
    mod_name[5] = '\0';
    mod_name[6] = '\0';
    mod_name[7] = '\0';
  }
  return 0;
}

Assistant:

int
resolve_schema_nodeid(const char *nodeid, const struct lys_node *start_parent, const struct lys_module *cur_module,
                      struct ly_set **ret, int extended, int no_node_error)
{
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *next, *elem;
    struct lys_node_augment *last_aug;
    int r, nam_len, mod_name_len = 0, is_relative = -1, all_desc, has_predicate, nodeid_end = 0;
    int yang_data_name_len, backup_mod_name_len = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *start_mod, *aux_mod = NULL;
    char *str;
    struct ly_ctx *ctx;

    assert(nodeid && (start_parent || cur_module) && ret);
    *ret = NULL;

    if (!cur_module) {
        cur_module = lys_node_module(start_parent);
    }
    ctx = cur_module->ctx;
    id = nodeid;

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return -1;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                            (extended ? &all_desc : NULL), extended);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative && !start_parent) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, nodeid, "Starting node must be provided for relative paths.");
        return -1;
    }

    /* descendant-schema-nodeid */
    if (is_relative) {
        cur_module = start_mod = lys_node_module(start_parent);

    /* absolute-schema-nodeid */
    } else {
        start_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
        if (!start_mod) {
            str = strndup(mod_name, mod_name_len);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return -1;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(start_mod, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
        }
    }

    while (1) {
        sibling = NULL;
        last_aug = NULL;

        if (start_parent) {
            if (mod_name && (strncmp(mod_name, cur_module->name, mod_name_len)
                    || (mod_name_len != (signed)strlen(cur_module->name)))) {
                /* we are getting into another module (augment) */
                aux_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
                if (!aux_mod) {
                    str = strndup(mod_name, mod_name_len);
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    free(str);
                    return -1;
                }
            } else {
                /* there is no mod_name, so why are we checking augments again?
                 * because this module may be not implemented and it augments something in another module and
                 * there is another augment augmenting that previous one */
                aux_mod = cur_module;
            }

            /* look into augments */
            if (!extended) {
get_next_augment:
                last_aug = lys_getnext_target_aug(last_aug, aux_mod, start_parent);
            }
        }

        while ((sibling = lys_getnext(sibling, (last_aug ? (struct lys_node *)last_aug : start_parent), start_mod,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_PARENTUSES | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, cur_module, mod_name, mod_name_len, name, nam_len);

            /* resolve predicate */
            if (extended && ((r == 0) || (r == 2) || (r == 3)) && has_predicate) {
                r = resolve_extended_schema_nodeid_predicate(id, sibling, cur_module, &nodeid_end);
                if (r == 1) {
                    continue;
                } else if (r == -1) {
                    return -1;
                }
            } else if (!id[0]) {
                nodeid_end = 1;
            }

            if (r == 0) {
                /* one matching result */
                if (nodeid_end) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                } else {
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        return -1;
                    }
                    start_parent = sibling;
                }
                break;
            } else if (r == 1) {
                continue;
            } else if (r == 2) {
                /* "*" */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else if (r == 3) {
                /* "." */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    if (start_parent) {
                        ly_set_add(*ret, (void *)start_parent, LY_SET_OPT_USEASLIST);
                    }
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else {
                LOGINT(ctx);
                return -1;
            }
        }

        /* skip predicate */
        if (extended && has_predicate) {
            while (id[0] == '[') {
                id = strchr(id, ']');
                if (!id) {
                    LOGINT(ctx);
                    return -1;
                }
                ++id;
            }
        }

        if (nodeid_end && ((r == 0) || (r == 2) || (r == 3))) {
            return EXIT_SUCCESS;
        }

        /* no match */
        if (!sibling) {
            if (last_aug) {
                /* it still could be in another augment */
                goto get_next_augment;
            }
            if (no_node_error) {
                str = strndup(nodeid, (name - nodeid) + nam_len);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                                (extended ? &all_desc : NULL), extended);
        if (r < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return -1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return -1;
}